

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void madd_stride(double *A,double *B,double *C,int rows,int cols,int sA,int sB,int sC)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < rows) {
    uVar1 = 0;
    do {
      if (0 < cols) {
        uVar2 = 0;
        do {
          C[uVar2] = A[uVar2] + B[uVar2];
          uVar2 = uVar2 + 1;
        } while ((uint)cols != uVar2);
      }
      uVar1 = uVar1 + 1;
      C = C + sC;
      B = B + sB;
      A = A + sA;
    } while (uVar1 != (uint)rows);
  }
  return;
}

Assistant:

void madd_stride(double* A, double* B, double* C,int rows,int cols,int sA,int sB,int sC) {
	int i,j,u,v,w;
	 
	for (i = 0; i < rows; ++i) {
		u = i * sC;
		v = i * sA;
		w = i * sB;
		for(j = 0; j < cols;j++) {
			C[j + u] = A[j + v] + B[j + w];
		}
	}
}